

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_tests.cpp
# Opt level: O0

void immutable::test_internal_node(void)

{
  __int_type _Var1;
  internal_node<char,_true> *piVar2;
  ref<immutable::rrb_details::internal_node<char,_true>_> local_40;
  ref<immutable::rrb_details::internal_node<char,_true>_> dec;
  ref<immutable::rrb_details::internal_node<char,_true>_> inc;
  ref<immutable::rrb_details::internal_node<char,_true>_> copy;
  ref<immutable::rrb_details::internal_node<char,_true>_> local_18;
  ref<immutable::rrb_details::internal_node<char,_true>_> local_10;
  ref<immutable::rrb_details::internal_node<char,_true>_> in;
  
  piVar2 = rrb_details::internal_node_create<char,true>(8);
  ref<immutable::rrb_details::internal_node<char,_true>_>::ref(&local_10,piVar2);
  piVar2 = rrb_details::internal_node_create<char,true>(5);
  ref<immutable::rrb_details::internal_node<char,_true>_>::ref(&local_18,piVar2);
  piVar2 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&local_10);
  ref<immutable::rrb_details::internal_node<char,_true>_>::operator=(piVar2->child,&local_18);
  ref<immutable::rrb_details::internal_node<char,_true>_>::~ref(&local_18);
  piVar2 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&local_10);
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_int((__atomic_base *)&piVar2->_ref_count);
  TestEq<bool,bool>(true,_Var1 == 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x57,"void immutable::test_internal_node()");
  piVar2 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&local_10);
  TestEq<bool,bool>(true,piVar2->len == 8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x58,"void immutable::test_internal_node()");
  piVar2 = rrb_details::internal_node_clone<char,true>(local_10.ptr);
  ref<immutable::rrb_details::internal_node<char,_true>_>::ref(&inc,piVar2);
  piVar2 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&inc);
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_int((__atomic_base *)&piVar2->_ref_count);
  TestEq<bool,bool>(true,_Var1 == 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x5c,"void immutable::test_internal_node()");
  piVar2 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&inc);
  TestEq<bool,bool>(true,piVar2->len == 8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x5d,"void immutable::test_internal_node()");
  piVar2 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&local_10);
  piVar2 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(piVar2->child);
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_int((__atomic_base *)&piVar2->_ref_count);
  TestEq<bool,bool>(true,_Var1 == 2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x5e,"void immutable::test_internal_node()");
  piVar2 = rrb_details::internal_node_inc<char,true>(local_10.ptr);
  ref<immutable::rrb_details::internal_node<char,_true>_>::ref(&dec,piVar2);
  piVar2 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&dec);
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_int((__atomic_base *)&piVar2->_ref_count);
  TestEq<bool,bool>(true,_Var1 == 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x61,"void immutable::test_internal_node()");
  piVar2 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&dec);
  TestEq<bool,bool>(true,piVar2->len == 9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x62,"void immutable::test_internal_node()");
  piVar2 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&local_10);
  piVar2 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(piVar2->child);
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_int((__atomic_base *)&piVar2->_ref_count);
  TestEq<bool,bool>(true,_Var1 == 3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,99,"void immutable::test_internal_node()");
  piVar2 = rrb_details::internal_node_dec<char,true>(local_10.ptr);
  ref<immutable::rrb_details::internal_node<char,_true>_>::ref(&local_40,piVar2);
  piVar2 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&local_40);
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_int((__atomic_base *)&piVar2->_ref_count);
  TestEq<bool,bool>(true,_Var1 == 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x66,"void immutable::test_internal_node()");
  piVar2 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&local_40);
  TestEq<bool,bool>(true,piVar2->len == 7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x67,"void immutable::test_internal_node()");
  piVar2 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&local_10);
  piVar2 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(piVar2->child);
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_int((__atomic_base *)&piVar2->_ref_count);
  TestEq<bool,bool>(true,_Var1 == 4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x68,"void immutable::test_internal_node()");
  ref<immutable::rrb_details::internal_node<char,_true>_>::~ref(&local_40);
  ref<immutable::rrb_details::internal_node<char,_true>_>::~ref(&dec);
  ref<immutable::rrb_details::internal_node<char,_true>_>::~ref(&inc);
  ref<immutable::rrb_details::internal_node<char,_true>_>::~ref(&local_10);
  return;
}

Assistant:

void test_internal_node()
    {
    using namespace rrb_details;

    ref<internal_node<char, true>> in = internal_node_create<char, true>(8);

    in->child[0] = internal_node_create<char, true>(5);
    TEST_ASSERT(in->_ref_count == 1);
    TEST_ASSERT(in->len == 8);

    ref<internal_node<char, true>> copy = internal_node_clone(in.ptr);

    TEST_ASSERT(copy->_ref_count == 1);
    TEST_ASSERT(copy->len == 8);
    TEST_ASSERT(in->child[0]->_ref_count == 2);

    ref<internal_node<char, true>> inc = internal_node_inc(in.ptr);
    TEST_ASSERT(inc->_ref_count == 1);
    TEST_ASSERT(inc->len == 9);
    TEST_ASSERT(in->child[0]->_ref_count == 3);

    ref<internal_node<char, true>> dec = internal_node_dec(in.ptr);
    TEST_ASSERT(dec->_ref_count == 1);
    TEST_ASSERT(dec->len == 7);
    TEST_ASSERT(in->child[0]->_ref_count == 4);
    }